

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int Rescale(uint8_t *src,int src_stride,int new_lines,WebPRescaler *wrk)

{
  int iVar1;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  WebPRescaler *unaff_retaddr;
  int lines_in;
  int num_lines_out;
  int iVar2;
  
  iVar2 = 0;
  while (0 < in_EDX) {
    iVar1 = WebPRescalerImport(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                               (uint8_t *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20));
    in_RDI = in_RDI + iVar1 * in_ESI;
    in_EDX = in_EDX - iVar1;
    iVar1 = WebPRescalerExport((WebPRescaler *)CONCAT44(iVar2,iVar1));
    iVar2 = iVar1 + iVar2;
  }
  return iVar2;
}

Assistant:

static int Rescale(const uint8_t* src, int src_stride,
                   int new_lines, WebPRescaler* const wrk) {
  int num_lines_out = 0;
  while (new_lines > 0) {    // import new contributions of source rows.
    const int lines_in = WebPRescalerImport(wrk, new_lines, src, src_stride);
    src += lines_in * src_stride;
    new_lines -= lines_in;
    num_lines_out += WebPRescalerExport(wrk);    // emit output row(s)
  }
  return num_lines_out;
}